

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileBreak(jx9_gen_state *pGen)

{
  sxi64 sVar1;
  sxu32 local_30;
  sxi32 local_2c;
  sxu32 nInstrIdx;
  sxi32 rc;
  sxu32 nLine;
  sxi32 iLevel;
  GenBlock *pLoop;
  jx9_gen_state *pGen_local;
  
  nInstrIdx = pGen->pIn->nLine;
  rc = 0;
  pGen->pIn = pGen->pIn + 1;
  pLoop = (GenBlock *)pGen;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 3) != 0)) {
    sVar1 = jx9TokenValueToInt64(&pGen->pIn->sData);
    rc = (sxi32)sVar1;
    if (rc < 2) {
      rc = 0;
    }
    *(long *)&pLoop[2].aPostContFix.eSize = *(long *)&pLoop[2].aPostContFix.eSize + 0x20;
  }
  _nLine = GenStateFetchBlock((GenBlock *)pLoop[1].aPostContFix.pAllocator,1,rc);
  if (_nLine == (GenBlock *)0x0) {
    local_2c = jx9GenCompileError((jx9_gen_state *)pLoop,1,
                                  *(sxu32 *)(*(long *)&pLoop[2].aPostContFix.eSize + 0x14),
                                  "A \'break\' statement may only be used within a loop or switch");
    if (local_2c == -10) {
      return -10;
    }
  }
  else {
    local_2c = jx9VmEmitInstr((jx9_vm *)pLoop->pGen,8,0,0,(void *)0x0,&local_30);
    if (local_2c == 0) {
      GenStateNewJumpFixup(_nLine,8,local_30);
    }
  }
  if ((*(void **)&pLoop[2].aPostContFix.eSize < pLoop[2].aPostContFix.pUserData) &&
     ((*(uint *)(*(long *)&pLoop[2].aPostContFix.eSize + 0x10) & 0x40000) == 0)) {
    jx9GenCompileError((jx9_gen_state *)pLoop,2,
                       *(sxu32 *)(*(long *)&pLoop[2].aPostContFix.eSize + 0x14),
                       "Expected semi-colon \';\' after \'break\' statement");
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileBreak(jx9_gen_state *pGen)
{
	GenBlock *pLoop; /* Target loop */
	sxi32 iLevel;    /* How many nesting loop to skip */
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	iLevel = 0;
	/* Jump the 'break' keyword */
	pGen->pIn++;
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_NUM) ){
		/* optional numeric argument which tells us how many levels
		 * of enclosing loops we should skip to the end of. 
		 */
		iLevel = (sxi32)jx9TokenValueToInt64(&pGen->pIn->sData);
		if( iLevel < 2 ){
			iLevel = 0;
		}
		pGen->pIn++; /* Jump the optional numeric argument */
	}
	/* Extract the target loop */
	pLoop = GenStateFetchBlock(pGen->pCurrent, GEN_BLOCK_LOOP, iLevel);
	if( pLoop == 0 ){
		/* Illegal break */
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, "A 'break' statement may only be used within a loop or switch");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}else{
		sxu32 nInstrIdx; 
		rc = jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, 0, 0, &nInstrIdx);
		if( rc == SXRET_OK ){
			/* Fix the jump later when the jump destination is resolved */
			GenStateNewJumpFixup(pLoop, JX9_OP_JMP, nInstrIdx);
		}
	}
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Not so fatal, emit a warning only */
		jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn->nLine, "Expected semi-colon ';' after 'break' statement");
	}
	/* Statement successfully compiled */
	return SXRET_OK;
}